

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O2

string * __thiscall
soul::makeUID_abi_cxx11_(string *__return_storage_ptr__,soul *this,ModuleBase *m)

{
  char *in_RCX;
  string_view name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  string local_88;
  ArrayWithPreallocation<soul::Identifier,_8UL> local_68;
  
  (**(code **)(*(long *)this + 0x70))(&local_68);
  IdentifierPath::toString_abi_cxx11_(&local_a8,(IdentifierPath *)&local_68);
  Program::stripRootNamespaceFromQualifiedPath(&local_88,&local_a8);
  std::operator+(&local_c8,"mod_",&local_88);
  name._M_str = in_RCX;
  name._M_len = (size_t)local_c8._M_dataplus._M_p;
  makeUID_abi_cxx11_(__return_storage_ptr__,(soul *)local_c8._M_string_length,name);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  ArrayWithPreallocation<soul::Identifier,_8UL>::clear(&local_68);
  return __return_storage_ptr__;
}

Assistant:

static std::string makeUID (AST::ModuleBase& m)             { return makeUID ("mod_" + Program::stripRootNamespaceFromQualifiedPath (m.getFullyQualifiedDisplayPath().toString())); }